

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage(MemoryLeakDetector *this)

{
  MemoryLeakDetectorNode *pMVar1;
  MemoryLeakDetectorTable *in_RDI;
  void *unaff_retaddr;
  TestMemoryAllocator *allocator;
  MemoryLeakDetectorNode *node;
  char *memory;
  undefined8 in_stack_ffffffffffffffe0;
  MemoryLeakDetectorTable *in_stack_ffffffffffffffe8;
  MemoryLeakDetectorNode *leak;
  
  pMVar1 = MemoryLeakDetectorTable::getFirstLeakForAllocationStage
                     (in_stack_ffffffffffffffe8,(uchar)((ulong)in_stack_ffffffffffffffe0 >> 0x38));
  while (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
    leak = *(MemoryLeakDetectorNode **)(pMVar1 + 0x10);
    pMVar1 = MemoryLeakDetectorTable::getNextLeakForAllocationStage
                       (in_RDI,leak,(uchar)((ulong)pMVar1 >> 0x38));
    deallocMemory((MemoryLeakDetector *)node,allocator,unaff_retaddr,(char *)in_RDI,(size_t)leak,
                  SUB81((ulong)pMVar1 >> 0x38,0));
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocAllMemoryInCurrentAllocationStage()
{
    char* memory = NULLPTR;
    MemoryLeakDetectorNode* node = memoryTable_.getFirstLeakForAllocationStage(current_allocation_stage_);
    while (node) {
        memory = node->memory_;
        TestMemoryAllocator* allocator = node->allocator_;
        node = memoryTable_.getNextLeakForAllocationStage(node, current_allocation_stage_);
        deallocMemory(allocator, memory, __FILE__, __LINE__);
    }
}